

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O0

int find_label(disctx *ctx,section *sect,int ofs,int start_at)

{
  int local_28;
  int i;
  int start_at_local;
  int ofs_local;
  section *sect_local;
  disctx *ctx_local;
  
  if (sect->first_label != -1) {
    local_28 = start_at;
    if (start_at < 0) {
      local_28 = sect->first_label;
    }
    for (i = local_28; i <= sect->last_label; i = i + 1) {
      if ((ctx->labels[i].type == 0) && (ctx->labels[i].val == (long)ofs)) {
        return i;
      }
    }
  }
  return -1;
}

Assistant:

int find_label(struct disctx *ctx, struct section *sect, int ofs, int start_at) {
	int i;
	/* Doesn't have any labels */
	if (sect->first_label == -1)
		return -1;
	for (i = start_at >= 0 ? start_at : sect->first_label; i <= sect->last_label; i++) {
		if (ctx->labels[i].type == 0 && ctx->labels[i].val == ofs)
			return i;
	}
	return -1;
}